

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  float fVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ImGuiDataType data_type_00;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 is_logarithmic;
  bool bVar9;
  float logarithmic_zero_epsilon;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pIVar2 = GImGui;
  uVar8 = flags & 0x100000;
  uVar7 = data_type & 0xfffffffe;
  uVar5 = v_min - v_max;
  uVar6 = -uVar5;
  if (0 < (int)uVar5) {
    uVar6 = uVar5;
  }
  fVar16 = *(float *)((long)&(bb->Min).x + (ulong)(uVar8 >> 0x12));
  fVar1 = *(float *)((long)&(bb->Max).x + (ulong)(uVar8 >> 0x12));
  fVar17 = (fVar1 - fVar16) + -4.0;
  fVar14 = (GImGui->Style).GrabMinSize;
  if (uVar7 != 8) {
    fVar13 = fVar17 / (float)(int)(uVar6 + 1);
    uVar5 = -(uint)(fVar14 <= fVar13);
    fVar14 = (float)(~uVar5 & (uint)fVar14 | (uint)fVar13 & uVar5);
  }
  if (fVar17 <= fVar14) {
    fVar14 = fVar17;
  }
  fVar18 = fVar17 - fVar14;
  fVar13 = 0.0;
  logarithmic_zero_epsilon = 0.0;
  iVar4 = v_max;
  if ((flags & 0x20U) != 0) {
    if (uVar7 == 8) {
      iVar3 = ImParseFormatPrecision(format,3);
      fVar13 = (float)iVar3;
    }
    else {
      fVar13 = 1.0;
    }
    logarithmic_zero_epsilon = powf(0.1,fVar13);
    fVar13 = fVar18;
    if (fVar18 <= 1.0) {
      fVar13 = 1.0;
    }
    fVar13 = ((pIVar2->Style).LogSliderDeadzone * 0.5) / fVar13;
  }
  is_logarithmic = (undefined1)iVar4;
  fVar16 = fVar16 + 2.0 + fVar14 * 0.5;
  if (pIVar2->ActiveId != id) {
    bVar9 = false;
    goto LAB_001715bd;
  }
  if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar2->ActiveIdIsJustActivated == true) {
      pIVar2->SliderCurrentAccum = 0.0;
      pIVar2->SliderCurrentAccumDirty = false;
    }
    IVar12 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar18 = IVar12.x;
    if (uVar8 != 0) {
      fVar18 = -IVar12.y;
    }
    if ((fVar18 != 0.0) || (NAN(fVar18))) {
      if ((uVar7 == 8) && (iVar4 = ImParseFormatPrecision(format,3), 0 < iVar4)) {
        fVar18 = fVar18 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar18 = fVar18 / 10.0;
        }
      }
      else if ((uVar6 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
        fVar18 = *(float *)(&DAT_0017c0d0 + (ulong)(fVar18 < 0.0) * 4) / (float)(int)uVar6;
      }
      else {
        fVar18 = fVar18 / 100.0;
      }
      uVar6 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      pIVar2->SliderCurrentAccum =
           (float)(~uVar6 & (uint)fVar18 | (uint)(fVar18 * 10.0) & uVar6) +
           pIVar2->SliderCurrentAccum;
      pIVar2->SliderCurrentAccumDirty = true;
    }
    fVar18 = pIVar2->SliderCurrentAccum;
    if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if (pIVar2->SliderCurrentAccumDirty == true) {
      uVar6 = (flags & 0x20U) >> 5;
      fVar11 = ScaleRatioFromValueT<int,int,float>
                         ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,uVar6,(bool)is_logarithmic,
                          logarithmic_zero_epsilon,fVar13);
      if (((1.0 <= fVar11) && (0.0 < fVar18)) || ((fVar11 <= 0.0 && (fVar18 < 0.0)))) {
        fVar15 = 0.0;
        bVar9 = false;
        fVar10 = fVar11;
      }
      else {
        fVar15 = fVar18 + fVar11;
        fVar10 = 1.0;
        if (fVar15 <= 1.0) {
          fVar10 = fVar15;
        }
        fVar10 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar10);
        uVar5 = uVar6;
        data_type_00 = ScaleValueFromRatioT<int,int,float>
                                 (data_type,fVar10,v_min,v_max,SUB41(uVar6,0),
                                  logarithmic_zero_epsilon,fVar13);
        if ((flags & 0x40U) == 0) {
          data_type_00 = RoundScalarWithFormatT<int,int>
                                   ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,
                                    uVar5);
        }
        fVar15 = ScaleRatioFromValueT<int,int,float>
                           ((ImGui *)(ulong)(uint)data_type,data_type_00,v_min,v_max,uVar6,
                            (bool)is_logarithmic,logarithmic_zero_epsilon,fVar13);
        fVar15 = fVar15 - fVar11;
        if (fVar18 <= 0.0) {
          fVar15 = (float)(~-(uint)(fVar18 <= fVar15) & (uint)fVar18 |
                          (uint)fVar15 & -(uint)(fVar18 <= fVar15));
        }
        else if (fVar18 <= fVar15) {
          fVar15 = fVar18;
        }
        fVar15 = pIVar2->SliderCurrentAccum - fVar15;
        bVar9 = true;
      }
      pIVar2->SliderCurrentAccum = fVar15;
      pIVar2->SliderCurrentAccumDirty = false;
      goto LAB_00171546;
    }
    bVar9 = false;
    fVar10 = 0.0;
  }
  else {
    fVar10 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar2->IO).MouseDown[0] != false) {
        if (0.0 < fVar18) {
          fVar18 = (*(float *)((pIVar2->IO).MouseDown + (ulong)(uVar8 >> 0x14) * 4 + -8) - fVar16) /
                   fVar18;
          fVar10 = 1.0;
          if (fVar18 <= 1.0) {
            fVar10 = fVar18;
          }
          fVar10 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar10);
        }
        if (uVar8 != 0) {
          fVar10 = 1.0 - fVar10;
        }
        bVar9 = true;
        goto LAB_00171546;
      }
      ClearActiveID();
    }
    fVar10 = 0.0;
    bVar9 = false;
  }
LAB_00171546:
  if (bVar9) {
    uVar6 = (flags & 0x20U) >> 5;
    iVar4 = ScaleValueFromRatioT<int,int,float>
                      (data_type,fVar10,v_min,v_max,SUB41(uVar6,0),logarithmic_zero_epsilon,fVar13);
    if ((flags & 0x40U) == 0) {
      iVar4 = RoundScalarWithFormatT<int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,iVar4,uVar6);
    }
    bVar9 = *v != iVar4;
    if (bVar9) {
      *v = iVar4;
      bVar9 = true;
    }
  }
  else {
    bVar9 = false;
  }
LAB_001715bd:
  if (1.0 <= fVar17) {
    fVar17 = ScaleRatioFromValueT<int,int,float>
                       ((ImGui *)(ulong)(uint)data_type,*v,v_min,v_max,(flags & 0x20U) >> 5,
                        (bool)is_logarithmic,logarithmic_zero_epsilon,fVar13);
    if (uVar8 != 0) {
      fVar17 = 1.0 - fVar17;
    }
    fVar16 = (((fVar1 + -2.0) - fVar14 * 0.5) - fVar16) * fVar17 + fVar16;
    if (uVar8 != 0) {
      fVar1 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar14 * 0.5 + fVar16;
      (out_grab_bb->Max).x = fVar1 + -2.0;
      (out_grab_bb->Max).y = fVar14 * 0.5 + fVar16;
    }
    else {
      fVar1 = (bb->Min).y;
      fVar17 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar14 * 0.5 + fVar16;
      (out_grab_bb->Min).y = fVar1 + 2.0;
      (out_grab_bb->Max).x = fVar14 * 0.5 + fVar16;
      (out_grab_bb->Max).y = fVar17 + -2.0;
    }
  }
  else {
    IVar12 = bb->Min;
    out_grab_bb->Min = IVar12;
    out_grab_bb->Max = IVar12;
  }
  return bVar9;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_floating_point && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}